

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void solve_dataflow(gen_ctx_t gen_ctx,int forward_p,_func_void_bb_t *con_func_0,
                   _func_int_gen_ctx_t_bb_t *con_func_n,_func_int_gen_ctx_t_bb_t *trans_func)

{
  MIR_alias_t MVar1;
  MIR_alias_t MVar2;
  VARR_bb_t *pVVar3;
  gen_ctx_t __base;
  gen_ctx_t pgVar4;
  void *pvVar5;
  bb_t pbVar6;
  bb_insn_t dst;
  MIR_insn_t pMVar7;
  bitmap_el_t *pbVar8;
  bitmap_t dst_00;
  ulong *puVar9;
  undefined8 *puVar10;
  long lVar11;
  ulong *puVar12;
  bool bVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  bb_t_conflict *ppbVar17;
  VARR_bb_t *pVVar18;
  data_flow_ctx *pdVar19;
  bb_insn_t pbVar20;
  bitmap_t pVVar21;
  ulong uVar22;
  bb_t_conflict pbVar23;
  bb_insn_t pbVar24;
  const_bitmap_t pVVar25;
  out_edge_t peVar26;
  in_edge_t_conflict peVar27;
  const_bitmap_t pVVar28;
  const_bitmap_t pVVar29;
  undefined4 in_register_00000034;
  code *__compar;
  gen_ctx_t __nmemb;
  const_bitmap_t src;
  bitmap_t pVVar30;
  const_bitmap_t mem2;
  gen_ctx_t __ptr;
  MIR_op_t *dst_01;
  ulong uVar31;
  MIR_op_t *pMVar32;
  MIR_insn_t pMVar33;
  const_bitmap_t pVVar34;
  size_t sVar35;
  MIR_insn_t pMVar36;
  const_bitmap_t pVStack_d0;
  long local_60;
  
  __nmemb = (gen_ctx_t)CONCAT44(in_register_00000034,forward_p);
  pVVar18 = gen_ctx->data_flow_ctx->worklist;
  __ptr = gen_ctx;
  if ((pVVar18 == (VARR_bb_t *)0x0) || (pVVar18->varr == (bb_t_conflict *)0x0)) {
LAB_0016752a:
    solve_dataflow_cold_11();
  }
  else {
    pVVar18->els_num = 0;
    for (pbVar23 = (gen_ctx->curr_cfg->bbs).head; pbVar23 != (bb_t_conflict)0x0;
        pbVar23 = (pbVar23->bb_link).next) {
      pVVar18 = gen_ctx->data_flow_ctx->worklist;
      __ptr = (gen_ctx_t)pVVar18->varr;
      if (__ptr == (gen_ctx_t)0x0) goto LAB_00167525;
      uVar16 = pVVar18->els_num + 1;
      if (pVVar18->size < uVar16) {
        sVar35 = (uVar16 >> 1) + uVar16;
        __nmemb = (gen_ctx_t)(sVar35 * 8);
        ppbVar17 = (bb_t_conflict *)realloc(__ptr,(size_t)__nmemb);
        pVVar18->varr = ppbVar17;
        pVVar18->size = sVar35;
      }
      sVar35 = pVVar18->els_num;
      pVVar18->els_num = sVar35 + 1;
      pVVar18->varr[sVar35] = pbVar23;
    }
    pVVar18 = gen_ctx->data_flow_ctx->pending;
    if ((pVVar18 != (VARR_bb_t *)0x0) && (pVVar18->varr != (bb_t_conflict *)0x0)) {
      pVVar18->els_num = 0;
      pdVar19 = gen_ctx->data_flow_ctx;
      pVVar18 = pdVar19->worklist;
      if (pVVar18 != (VARR_bb_t *)0x0) {
        __compar = rpost_cmp;
        if (forward_p == 0) {
          __compar = post_cmp;
        }
        local_60 = 0;
        __nmemb = (gen_ctx_t)__compar;
        do {
          if (pVVar18->els_num == 0) {
            return;
          }
          pVVar3 = pdVar19->pending;
          if ((pVVar3 == (VARR_bb_t *)0x0) || (pVVar3->varr == (bb_t_conflict *)0x0)) {
LAB_0016751b:
            solve_dataflow_cold_8();
LAB_00167520:
            solve_dataflow_cold_7();
LAB_00167525:
            solve_dataflow_cold_1();
            goto LAB_0016752a;
          }
          pVVar3->els_num = 0;
          __nmemb = (gen_ctx_t)pVVar18->els_num;
          __base = (gen_ctx_t)pVVar18->varr;
          __ptr = __base;
          qsort(__base,(size_t)__nmemb,8,__compar);
          pVVar30 = gen_ctx->data_flow_ctx->bb_to_consider;
          if ((pVVar30 == (bitmap_t)0x0) || (pVVar30->varr == (bitmap_el_t *)0x0))
          goto LAB_00167520;
          pVVar30->els_num = 0;
          pdVar19 = gen_ctx->data_flow_ctx;
          pVVar18 = pdVar19->worklist;
          if (pVVar18 == (VARR_bb_t *)0x0) {
LAB_00167516:
            solve_dataflow_cold_6();
            goto LAB_0016751b;
          }
          if (pVVar18->els_num != 0) {
            uVar16 = 0;
            do {
              pgVar4 = (gen_ctx_t)__base->call_used_hard_regs[uVar16 - 0xd];
              if (forward_p == 0) {
                if (((DLIST_out_edge_t *)&pgVar4->addr_regs)->head != (out_edge_t)0x0)
                goto LAB_001672fb;
LAB_00167311:
                __ptr = pgVar4;
                (*con_func_0)((bb_t_conflict)pgVar4);
                uVar14 = (uint)(local_60 == 0);
              }
              else {
                if (((DLIST_in_edge_t *)&pgVar4->addr_insn_p)->head == (in_edge_t_conflict)0x0)
                goto LAB_00167311;
LAB_001672fb:
                __nmemb = pgVar4;
                __ptr = gen_ctx;
                uVar14 = (*con_func_n)(gen_ctx,(bb_t_conflict)pgVar4);
                uVar14 = uVar14 | local_60 == 0;
              }
              if ((uVar14 != 0) &&
                 (__nmemb = pgVar4, __ptr = gen_ctx,
                 iVar15 = (*trans_func)(gen_ctx,(bb_t_conflict)pgVar4), iVar15 != 0)) {
                if (forward_p == 0) {
                  for (peVar27 = ((DLIST_in_edge_t *)&pgVar4->addr_insn_p)->head;
                      peVar27 != (in_edge_t_conflict)0x0; peVar27 = (peVar27->in_link).next) {
                    pgVar4 = (gen_ctx_t)gen_ctx->data_flow_ctx->bb_to_consider;
                    uVar22 = peVar27->src->index;
                    __nmemb = (gen_ctx_t)(uVar22 + 1);
                    __ptr = pgVar4;
                    bitmap_expand((bitmap_t)pgVar4,(size_t)__nmemb);
                    if (pgVar4 == (gen_ctx_t)0x0) goto LAB_00167507;
                    pvVar5 = (&pgVar4->curr_func_item->data)[uVar22 >> 6];
                    __nmemb = (gen_ctx_t)((ulong)pvVar5 | 1L << (uVar22 & 0x3f));
                    (&pgVar4->curr_func_item->data)[uVar22 >> 6] = __nmemb;
                    if (((ulong)pvVar5 >> (uVar22 & 0x3f) & 1) == 0) {
                      pVVar18 = gen_ctx->data_flow_ctx->pending;
                      __ptr = (gen_ctx_t)pVVar18->varr;
                      if (__ptr == (gen_ctx_t)0x0) goto LAB_00167511;
                      pbVar6 = peVar27->src;
                      uVar22 = pVVar18->els_num + 1;
                      if (pVVar18->size < uVar22) {
                        sVar35 = (uVar22 >> 1) + uVar22;
                        __nmemb = (gen_ctx_t)(sVar35 * 8);
                        ppbVar17 = (bb_t_conflict *)realloc(__ptr,(size_t)__nmemb);
                        pVVar18->varr = ppbVar17;
                        pVVar18->size = sVar35;
                      }
                      sVar35 = pVVar18->els_num;
                      pVVar18->els_num = sVar35 + 1;
                      pVVar18->varr[sVar35] = pbVar6;
                    }
                  }
                }
                else {
                  for (peVar26 = ((DLIST_out_edge_t *)&pgVar4->addr_regs)->head;
                      peVar26 != (out_edge_t)0x0; peVar26 = (peVar26->out_link).next) {
                    pgVar4 = (gen_ctx_t)gen_ctx->data_flow_ctx->bb_to_consider;
                    uVar22 = peVar26->dst->index;
                    __nmemb = (gen_ctx_t)(uVar22 + 1);
                    __ptr = pgVar4;
                    bitmap_expand((bitmap_t)pgVar4,(size_t)__nmemb);
                    if (pgVar4 == (gen_ctx_t)0x0) {
                      solve_dataflow_cold_3();
LAB_00167507:
                      solve_dataflow_cold_5();
LAB_0016750c:
                      solve_dataflow_cold_2();
LAB_00167511:
                      solve_dataflow_cold_4();
                      goto LAB_00167516;
                    }
                    pvVar5 = (&pgVar4->curr_func_item->data)[uVar22 >> 6];
                    __nmemb = (gen_ctx_t)((ulong)pvVar5 | 1L << (uVar22 & 0x3f));
                    (&pgVar4->curr_func_item->data)[uVar22 >> 6] = __nmemb;
                    if (((ulong)pvVar5 >> (uVar22 & 0x3f) & 1) != 0) goto LAB_001673ee;
                    pVVar18 = gen_ctx->data_flow_ctx->pending;
                    __ptr = (gen_ctx_t)pVVar18->varr;
                    if (__ptr == (gen_ctx_t)0x0) goto LAB_0016750c;
                    pbVar6 = peVar26->dst;
                    uVar22 = pVVar18->els_num + 1;
                    if (pVVar18->size < uVar22) {
                      sVar35 = (uVar22 >> 1) + uVar22;
                      __nmemb = (gen_ctx_t)(sVar35 * 8);
                      ppbVar17 = (bb_t_conflict *)realloc(__ptr,(size_t)__nmemb);
                      pVVar18->varr = ppbVar17;
                      pVVar18->size = sVar35;
                    }
                    sVar35 = pVVar18->els_num;
                    pVVar18->els_num = sVar35 + 1;
                    pVVar18->varr[sVar35] = pbVar6;
LAB_001673ee:
                  }
                }
              }
              pdVar19 = gen_ctx->data_flow_ctx;
              pVVar18 = pdVar19->worklist;
              if (pVVar18 == (VARR_bb_t *)0x0) goto LAB_00167516;
              uVar16 = uVar16 + 1;
            } while (uVar16 < pVVar18->els_num);
          }
          local_60 = local_60 + 1;
          pdVar19->worklist = pdVar19->pending;
          pdVar19->pending = pVVar18;
          pdVar19 = gen_ctx->data_flow_ctx;
          pVVar18 = pdVar19->worklist;
        } while (pVVar18 != (VARR_bb_t *)0x0);
      }
      solve_dataflow_cold_9();
      return;
    }
  }
  solve_dataflow_cold_10();
  pVVar30 = __ptr->call_used_hard_regs[0];
  if ((pVVar30 != (bitmap_t)0x0) && (pVVar30->varr != (bitmap_el_t *)0x0)) {
    pVVar30->els_num = 0;
    return;
  }
  mem_av_con_func_0_cold_1();
  dst = ((DLIST_bb_insn_t *)&__ptr->temp_bitmap)->head;
  bitmap_copy((bitmap_t)dst,__nmemb->call_used_hard_regs[0]);
  peVar27 = ((DLIST_in_edge_t *)&__nmemb->addr_insn_p)->head;
  pVVar30 = __nmemb->call_used_hard_regs[0];
  src = peVar27->src->out;
  bitmap_copy(pVVar30,src);
  while (peVar27 = (peVar27->in_link).next, peVar27 != (in_edge_t)0x0) {
    src = __nmemb->call_used_hard_regs[0];
    pVVar30 = src;
    bitmap_and(src,src,peVar27->src->out);
  }
  pbVar24 = (bb_insn_t)__nmemb->call_used_hard_regs[0];
  if (pbVar24 == (bb_insn_t)0x0) {
    mem_av_con_func_n_cold_2();
  }
  else if (dst != (bb_insn_t)0x0) {
    pMVar36 = pbVar24->insn;
    pMVar7 = dst->insn;
    pbVar20 = dst;
    pMVar33 = pMVar7;
    if (pMVar7 < pMVar36) {
      pbVar20 = pbVar24;
      pbVar24 = dst;
      pMVar33 = pMVar36;
      pMVar36 = pMVar7;
    }
    pbVar8 = *(bitmap_el_t **)&pbVar20->mem_index;
    iVar15 = bcmp(*(bitmap_el_t **)&pbVar24->mem_index,pbVar8,(long)pMVar36 * 8);
    if ((iVar15 == 0) && (pMVar36 < pMVar33)) {
      do {
        if (pbVar8[(long)pMVar36] != 0) {
          return;
        }
        pMVar36 = (MIR_insn_t)((long)&pMVar36->data + 1);
      } while (pMVar33 != pMVar36);
    }
    return;
  }
  mem_av_con_func_n_cold_1();
  dst_00 = (bitmap_t)pVVar30[3].size;
  bitmap_copy(dst_00,(const_bitmap_t)src[4].varr);
  dst_01 = (MIR_op_t *)src[4].varr;
  mem2 = (const_bitmap_t)src[5].els_num;
  bitmap_copy((bitmap_t)dst_01,mem2);
  if ((char)src[4].els_num == '\0') {
    puVar9 = (ulong *)src[4].size;
    if (puVar9 != (ulong *)0x0) {
      pVVar28 = (const_bitmap_t)0x0;
      pVVar25 = src;
      do {
        uVar22 = (ulong)pVVar28 >> 6;
        uVar16 = *puVar9;
        bVar13 = true;
        if (uVar22 < uVar16) {
          dst_01 = (MIR_op_t *)puVar9[2];
          mem2 = (const_bitmap_t)(uVar16 << 6);
          pVVar29 = pVVar28;
LAB_00167715:
          if (((&dst_01->data)[uVar22] == (void *)0x0) ||
             (uVar31 = (ulong)(&dst_01->data)[uVar22] >> ((ulong)pVVar29 & 0x3f), uVar31 == 0))
          goto LAB_00167728;
          uVar16 = uVar31 & 1;
          pVStack_d0 = pVVar29;
          while (uVar16 == 0) {
            pVStack_d0 = (const_bitmap_t)((long)&pVStack_d0->els_num + 1);
            uVar16 = uVar31 & 2;
            uVar31 = uVar31 >> 1;
          }
          bVar13 = false;
          pVVar28 = (const_bitmap_t)((long)&pVStack_d0->els_num + 1);
        }
LAB_00167763:
        if (bVar13) goto LAB_00167654;
        puVar10 = *(undefined8 **)(pVVar30[0xe].els_num + 0x10);
        if (((puVar10 == (undefined8 *)0x0) || (puVar10[2] == 0)) ||
           ((const_bitmap_t)*puVar10 <= pVStack_d0)) goto LAB_001678ce;
        lVar11 = **(long **)(puVar10[2] + (long)pVStack_d0 * 8);
        pMVar32 = (MIR_op_t *)(lVar11 + 0x50);
        if (*(char *)(lVar11 + 0x28) == '\v') {
          pMVar32 = (MIR_op_t *)(lVar11 + 0x20);
        }
        puVar12 = (ulong *)src[5].els_num;
        if (puVar12 == (ulong *)0x0) goto LAB_001678c9;
        pVVar29 = (const_bitmap_t)0x0;
LAB_001677c6:
        uVar22 = (ulong)pVVar29 >> 6;
        uVar16 = *puVar12;
        bVar13 = true;
        pVVar34 = pVVar29;
        if (uVar22 < uVar16) {
          dst_01 = (MIR_op_t *)puVar12[2];
          mem2 = (const_bitmap_t)(uVar16 << 6);
LAB_001677e3:
          if (((&dst_01->data)[uVar22] == (void *)0x0) ||
             (uVar31 = (ulong)(&dst_01->data)[uVar22] >> ((ulong)pVVar29 & 0x3f), uVar31 == 0))
          goto LAB_001677f6;
          uVar16 = uVar31 & 1;
          pVVar25 = pVVar29;
          while (uVar16 == 0) {
            pVVar25 = (const_bitmap_t)((long)&pVVar25->els_num + 1);
            uVar16 = uVar31 & 2;
            uVar31 = uVar31 >> 1;
          }
          bVar13 = false;
          pVVar34 = (const_bitmap_t)((long)&pVVar25->els_num + 1);
        }
LAB_0016782a:
        if (!bVar13) {
          puVar10 = *(undefined8 **)(pVVar30[0xe].els_num + 0x10);
          if (((puVar10 == (undefined8 *)0x0) || (puVar10[2] == 0)) ||
             ((const_bitmap_t)*puVar10 <= pVVar25)) goto LAB_001678c4;
          mem2 = (const_bitmap_t)**(size_t **)(puVar10[2] + (long)pVVar25 * 8);
          if (*(char *)&mem2[1].varr == '\v') {
            mem2 = (const_bitmap_t)&mem2[1].size;
            dst_01 = pMVar32;
            iVar15 = may_mem_alias_p(pMVar32,(MIR_op_t *)mem2);
            if (iVar15 != 0) goto LAB_001678b1;
          }
          pVVar29 = pVVar34;
          if (puVar12 == (ulong *)0x0) goto LAB_001678c9;
          goto LAB_001677c6;
        }
        pMVar32 = (MIR_op_t *)src[4].varr;
        mem2 = (const_bitmap_t)((long)&pVStack_d0->els_num + 1);
        dst_01 = pMVar32;
        bitmap_expand((bitmap_t)pMVar32,(size_t)mem2);
        if (pMVar32 == (MIR_op_t *)0x0) goto LAB_001678d3;
        puVar12 = (bitmap_el_t *)(pMVar32->u).str.len + ((ulong)pVStack_d0 >> 6);
        *puVar12 = *puVar12 | 1L << ((ulong)pVStack_d0 & 0x3f);
LAB_001678b1:
        if (puVar9 == (ulong *)0x0) break;
      } while( true );
    }
    mem_av_trans_func_cold_7();
LAB_001678c4:
    mem_av_trans_func_cold_1();
LAB_001678c9:
    mem_av_trans_func_cold_3();
LAB_001678ce:
    mem_av_trans_func_cold_4();
LAB_001678d3:
    mem_av_trans_func_cold_2();
  }
  else {
LAB_00167654:
    pVVar30 = (bitmap_t)src[4].varr;
    if (pVVar30 != (bitmap_t)0x0) {
      mem2 = dst_00;
      if (dst_00 != (bitmap_t)0x0) {
        uVar16 = pVVar30->els_num;
        uVar22 = dst_00->els_num;
        pVVar21 = dst_00;
        uVar31 = uVar22;
        if (uVar22 < uVar16) {
          pVVar21 = pVVar30;
          pVVar30 = dst_00;
          uVar31 = uVar16;
          uVar16 = uVar22;
        }
        pbVar8 = pVVar21->varr;
        iVar15 = bcmp(pVVar30->varr,pbVar8,uVar16 * 8);
        if ((iVar15 == 0) && (uVar16 < uVar31)) {
          do {
            if (pbVar8[uVar16] != 0) {
              return;
            }
            uVar16 = uVar16 + 1;
          } while (uVar31 != uVar16);
        }
        return;
      }
      goto LAB_001678dd;
    }
  }
  mem_av_trans_func_cold_6();
LAB_001678dd:
  mem_av_trans_func_cold_5();
  if (((char)*(size_t *)&dst_01->field_0x8 != '\v') || ((char)mem2->size != '\v')) {
    __assert_fail("mem1->mode == MIR_OP_VAR_MEM && mem2->mode == MIR_OP_VAR_MEM",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xd72,"int may_mem_alias_p(const MIR_op_t *, const MIR_op_t *)");
  }
  MVar1 = (dst_01->u).mem.alias;
  MVar2 = *(MIR_alias_t *)((long)&mem2->varr + 4);
  if ((((MVar1 == MVar2) || (MVar1 == 0)) || (MVar2 == 0)) &&
     ((int)mem2[1].els_num != 0 && *(int *)((long)&dst_01->u + 8) != 0)) {
    return;
  }
  return;
LAB_00167728:
  uVar22 = uVar22 + 1;
  pVVar29 = (const_bitmap_t)(uVar22 * 0x40);
  pVVar28 = mem2;
  if (uVar16 == uVar22) goto LAB_00167763;
  goto LAB_00167715;
LAB_001677f6:
  uVar22 = uVar22 + 1;
  pVVar29 = (const_bitmap_t)(uVar22 * 0x40);
  pVVar34 = mem2;
  if (uVar16 == uVar22) goto LAB_0016782a;
  goto LAB_001677e3;
}

Assistant:

static void solve_dataflow (gen_ctx_t gen_ctx, int forward_p, void (*con_func_0) (bb_t),
                            int (*con_func_n) (gen_ctx_t, bb_t),
                            int (*trans_func) (gen_ctx_t, bb_t)) {
  size_t i, iter;
  bb_t bb, *addr;
  VARR (bb_t) * t;

  VARR_TRUNC (bb_t, worklist, 0);
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    VARR_PUSH (bb_t, worklist, bb);
  VARR_TRUNC (bb_t, pending, 0);
  iter = 0;
  while (VARR_LENGTH (bb_t, worklist) != 0) {
    VARR_TRUNC (bb_t, pending, 0);
    addr = VARR_ADDR (bb_t, worklist);
    qsort (addr, VARR_LENGTH (bb_t, worklist), sizeof (bb), forward_p ? rpost_cmp : post_cmp);
    bitmap_clear (bb_to_consider);
    for (i = 0; i < VARR_LENGTH (bb_t, worklist); i++) {
      int changed_p = iter == 0;
      edge_t e;

      bb = addr[i];
      if (forward_p) {
        if (DLIST_HEAD (in_edge_t, bb->in_edges) == NULL)
          con_func_0 (bb);
        else
          changed_p |= con_func_n (gen_ctx, bb);
      } else {
        if (DLIST_HEAD (out_edge_t, bb->out_edges) == NULL)
          con_func_0 (bb);
        else
          changed_p |= con_func_n (gen_ctx, bb);
      }
      if (changed_p && trans_func (gen_ctx, bb)) {
        if (forward_p) {
          for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL;
               e = DLIST_NEXT (out_edge_t, e))
            if (bitmap_set_bit_p (bb_to_consider, e->dst->index)) VARR_PUSH (bb_t, pending, e->dst);
        } else {
          for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = DLIST_NEXT (in_edge_t, e))
            if (bitmap_set_bit_p (bb_to_consider, e->src->index)) VARR_PUSH (bb_t, pending, e->src);
        }
      }
    }
    iter++;
    t = worklist;
    worklist = pending;
    pending = t;
  }
}